

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_write_ready(void)

{
  int iVar1;
  uv_os_sock_t uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  sockaddr_in addr;
  undefined1 auStack_18 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    uVar2 = create_tcp_socket();
    uVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar3,&client);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_open(&client,uVar2);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_connect(&connect_req,&client,auStack_18,connect1_cb);
        if (iVar1 == 0) {
          uVar3 = uv_default_loop();
          uv_run(uVar3,0);
          if (shutdown_cb_called == 1) {
            if (shutdown_requested == 1) {
              if (connect_cb_called == 1) {
                if (write_cb_called < 1) {
                  pcVar4 = "write_cb_called > 0";
                  uVar3 = 0x18b;
                }
                else if (close_cb_called == 1) {
                  loop = (uv_loop_t *)uv_default_loop();
                  close_loop(loop);
                  uVar3 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar3);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0x18e;
                }
                else {
                  pcVar4 = "close_cb_called == 1";
                  uVar3 = 0x18c;
                }
              }
              else {
                pcVar4 = "connect_cb_called == 1";
                uVar3 = 0x18a;
              }
            }
            else {
              pcVar4 = "shutdown_requested == 1";
              uVar3 = 0x189;
            }
          }
          else {
            pcVar4 = "shutdown_cb_called == 1";
            uVar3 = 0x188;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x184;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x17e;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x17b;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar3 = 0x175;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_write_ready) {
  struct sockaddr_in addr;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect1_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(shutdown_cb_called == 1);
  ASSERT(shutdown_requested == 1);
  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called > 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}